

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

uint * __thiscall
google::protobuf::Map<unsigned_int,_unsigned_int>::at<unsigned_int>
          (Map<unsigned_int,_unsigned_int> *this,key_arg<unsigned_int> *key)

{
  NodeAndBucket NVar1;
  string_view str;
  LogMessage LStack_28;
  key_arg<unsigned_int> local_14;
  
  NVar1 = protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
                    (&this->super_KeyMapBase<unsigned_int>,*key);
  if (NVar1.node != (NodeBase *)0x0) {
    return (uint *)((long)&NVar1.node[1].next + 4);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x4e8,"it != end()");
  str._M_str = "key not found: ";
  str._M_len = 0xf;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_28,str);
  local_14 = *key;
  absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_int,_0>(&LStack_28,&local_14);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }